

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O3

MPP_RET jpegd_parse(void *ctx,HalDecTask *task)

{
  undefined *puVar1;
  undefined *puVar2;
  MppBufSlots slots;
  MppFrame s;
  BitReadCtx_t *pBVar3;
  byte bVar4;
  ushort uVar5;
  RK_S32 RVar6;
  void *pvVar7;
  size_t sVar8;
  byte bVar9;
  char *pcVar10;
  int iVar11;
  RK_U8 *pRVar12;
  long lVar13;
  ulong uVar14;
  BitReadCtx_t *pBVar15;
  MppFrameFormat v;
  bool bVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  MPP_RET MVar22;
  int iVar23;
  RK_S32 RVar24;
  BitReadCtx_t *gb;
  RK_U8 *pRVar25;
  RK_S32 *out;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  bool bVar29;
  RK_S32 _out;
  void *local_b8;
  HalDecTask *local_b0;
  long local_a8;
  ulong local_a0;
  RK_U8 *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  undefined8 local_78;
  BitReadCtx_t *local_70;
  long local_68;
  ulong local_60;
  RK_U8 *local_58;
  RK_U8 *local_50;
  ulong local_48;
  BitReadCtx_t *local_40;
  undefined4 local_34;
  
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_parse");
  }
  task->valid = 0;
  pvVar7 = mpp_packet_get_data(*(MppPacket *)((long)ctx + 0x28));
  *(void **)((long)ctx + 0x50) = pvVar7;
  memset(*(void **)((long)ctx + 0x68),0,0x930);
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_decode_frame");
  }
  pRVar12 = *(RK_U8 **)((long)ctx + 0x50);
  uVar19 = *(uint *)((long)ctx + 0x20);
  local_40 = *(BitReadCtx_t **)((long)ctx + 0x60);
  local_a8 = *(long *)((long)ctx + 0x68);
  *(undefined2 *)(local_a8 + 0x929) = 0;
  if ((7 < (ulong)uVar19) && (pvVar7 = memchr(pRVar12,0xffd8,8), pvVar7 != (void *)0x0)) {
    local_98 = pRVar12 + uVar19;
    local_50 = local_98 + 1;
    local_b8 = ctx;
    local_b0 = task;
    local_58 = pRVar12;
LAB_001b8502:
    iVar11 = (int)pRVar12;
    iVar23 = (int)local_50;
    pRVar25 = pRVar12;
LAB_001b850b:
    pvVar7 = memchr(pRVar25,0xff,(ulong)(uint)(iVar23 - iVar11));
    if (pvVar7 == (void *)0x0) {
      _mpp_log_l(2,"jpegd_parser","Start codec not found!\n",(char *)0x0);
      goto LAB_001b967a;
    }
    bVar4 = *(byte *)((long)pvVar7 + 1);
    if ((byte)(bVar4 + 1) < 0xc1) goto code_r0x001b8538;
    uVar19 = (uint)bVar4;
    if ((jpegd_debug & 2) == 0) {
LAB_001b85b9:
      lVar13 = (long)local_98 - ((long)pvVar7 + 2);
      task = local_b0;
    }
    else {
      _mpp_log_l(4,"jpegd_parser","find_marker skipped %d bytes\n",(char *)0x0,
                 (long)pvVar7 - (long)pRVar12);
      task = local_b0;
      if ((jpegd_debug & 2) == 0) goto LAB_001b85b9;
      lVar13 = (long)local_98 - ((long)pvVar7 + 2);
      _mpp_log_l(4,"jpegd_parser","marker = 0x%x, avail_size_in_buf = %d\n",(char *)0x0,
                 (ulong)uVar19);
    }
    pRVar12 = (RK_U8 *)((long)pvVar7 + 2);
    *(uint *)((long)local_b8 + 0x58) = uVar19;
    mpp_set_bitread_ctx(local_40,pRVar12,(RK_S32)lVar13);
    uVar18 = (uint)bVar4;
    if ((bVar4 & 0xf8) == 0xd0) {
      if ((jpegd_debug & 0x40) != 0) {
        _mpp_log_l(4,"jpegd_parser","restart marker: %d\n",(char *)0x0,(ulong)(uVar19 & 7));
      }
    }
    else if (uVar18 != 0xc4 && (byte)(bVar4 + 0x3f) < 0xf) {
      _mpp_log_l(2,"jpegd_parser",
                 "Only baseline DCT is supported, unsupported entropy encoding 0x%x",
                 "jpegd_decode_frame",(ulong)uVar19);
      ctx = local_b8;
      goto LAB_001b9cda;
    }
    ctx = local_b8;
    switch(bVar4) {
    case 0xd8:
      *(undefined2 *)(local_a8 + 0x929) = 0;
      *(undefined4 *)(local_a8 + 0x89e) = 0;
      break;
    case 0xd9:
      *(undefined1 *)(local_a8 + 0x89f) = 1;
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","still exists %d bytes behind EOI marker\n",(char *)0x0,lVar13);
      }
      MVar22 = MPP_OK;
      pRVar25 = local_98;
      goto LAB_001b96b0;
    case 0xda:
      if (*(char *)(local_a8 + 0x8a0) == '\0') {
        pcVar10 = "Warning: only support baseline type\n";
        goto LAB_001b9b64;
      }
      pBVar15 = *(BitReadCtx_t **)((long)local_b8 + 0x60);
      lVar13 = *(long *)((long)local_b8 + 0x68);
      MVar22 = mpp_read_bits(pBVar15,8,&_out);
      pBVar15->ret = MVar22;
      uVar19 = 0;
      if (MVar22 == MPP_OK) {
        local_a0 = CONCAT44(local_a0._4_4_,_out);
        MVar22 = mpp_read_bits(pBVar15,8,&_out);
        pBVar15->ret = MVar22;
        uVar19 = 0;
        if (MVar22 != MPP_OK) goto LAB_001b8bac;
        uVar19 = ((uint)local_a0 & 0xff) << 8 | _out & 0xffU;
        if (uVar19 <= pBVar15->bytes_left_) goto LAB_001b8bac;
        pcVar10 = "len %d is too large\n";
        uVar21 = (ulong)uVar19;
LAB_001b9910:
        _mpp_log_l(2,"jpegd_parser",pcVar10,"jpegd_decode_sos",uVar21);
        ctx = local_b8;
        task = local_b0;
      }
      else {
LAB_001b8bac:
        *(uint *)(lVar13 + 0x8a4) = uVar19;
        MVar22 = mpp_read_bits(pBVar15,8,&_out);
        pBVar15->ret = MVar22;
        if (MVar22 == MPP_OK) {
          if ((_out & 0xfffffffdU) != 1) {
            pcVar10 = "decode_sos: nb_components %d unsupported\n";
            uVar21 = (ulong)(uint)_out;
            goto LAB_001b9910;
          }
          if (_out * 2 + 6U != uVar19) {
            _mpp_log_l(2,"jpegd_parser","decode_sos: invalid len (%d), nb_components:%d\n",
                       "jpegd_decode_sos",(ulong)uVar19);
            ctx = local_b8;
            task = local_b0;
            goto LAB_001b9921;
          }
          *(char *)(lVar13 + 0x8a1) = (char)_out;
          uVar27 = 0;
          local_a0 = (ulong)(uint)_out;
          do {
            MVar22 = mpp_read_bits(pBVar15,8,&_out);
            pBVar15->ret = MVar22;
            if (MVar22 != MPP_OK) goto LAB_001b9a1c;
            uVar19 = _out - 1;
            if ((jpegd_debug & 2) != 0) {
              _mpp_log_l(4,"jpegd_parser","sos component: %d\n",(char *)0x0,(ulong)uVar19);
            }
            uVar21 = (ulong)*(uint *)(lVar13 + 0x8d0);
            uVar14 = 0;
            if (uVar21 != 0) {
              while (uVar19 != *(uint *)(lVar13 + 0x8d4 + uVar14 * 4)) {
                uVar14 = uVar14 + 1;
                if (uVar21 == uVar14) goto LAB_001b98f6;
              }
            }
            if ((uint)uVar14 == *(uint *)(lVar13 + 0x8d0)) {
LAB_001b98f6:
              pcVar10 = "decode_sos: index(%d) out of components\n";
              goto LAB_001b9910;
            }
            MVar22 = mpp_read_bits(pBVar15,4,&_out);
            pBVar15->ret = MVar22;
            if (MVar22 != MPP_OK) goto LAB_001b9a1c;
            *(RK_S32 *)(lVar13 + 0x8f8 + uVar27 * 4) = _out;
            MVar22 = mpp_read_bits(pBVar15,4,&_out);
            pBVar15->ret = MVar22;
            if (MVar22 != MPP_OK) goto LAB_001b9a1c;
            *(RK_S32 *)(lVar13 + 0x904 + uVar27 * 4) = _out;
            if ((jpegd_debug & 2) != 0) {
              _mpp_log_l(4,"jpegd_parser","component:%d, dc_index:%d, ac_index:%d\n",(char *)0x0,
                         (ulong)uVar19,(ulong)*(uint *)(lVar13 + 0x8f8 + uVar27 * 4),
                         (ulong)(uint)_out);
            }
            if ((1 < *(uint *)(lVar13 + 0x8f8 + uVar27 * 4)) ||
               (1 < *(uint *)(lVar13 + 0x904 + uVar27 * 4))) {
              _mpp_log_l(2,"jpegd_parser","Huffman table id error\n","jpegd_decode_sos");
              ctx = local_b8;
              task = local_b0;
              goto LAB_001b9921;
            }
            uVar27 = uVar27 + 1;
          } while (uVar27 != local_a0);
          MVar22 = mpp_read_bits(pBVar15,8,&_out);
          pBVar15->ret = MVar22;
          if (MVar22 == MPP_OK) {
            *(char *)(lVar13 + 0x89a) = (char)_out;
            MVar22 = mpp_read_bits(pBVar15,8,&_out);
            pBVar15->ret = MVar22;
            if (MVar22 != MPP_OK) goto LAB_001b9a1c;
            *(char *)(lVar13 + 0x89b) = (char)_out;
            MVar22 = mpp_read_bits(pBVar15,4,&_out);
            pBVar15->ret = MVar22;
            if (MVar22 == MPP_OK) {
              *(char *)(lVar13 + 0x89c) = (char)_out;
              MVar22 = mpp_read_bits(pBVar15,4,&_out);
              task = local_b0;
              ctx = local_b8;
              pBVar15->ret = MVar22;
              if (MVar22 == MPP_OK) {
                *(byte *)(lVar13 + 0x89d) = (byte)_out;
                uVar21 = (ulong)*(byte *)(lVar13 + 0x89a);
                bVar4 = *(byte *)(lVar13 + 0x89b);
                if (*(byte *)(lVar13 + 0x89a) == 0) {
                  uVar21 = 0;
                  bVar9 = *(byte *)(lVar13 + 0x89c);
                  if (((bVar4 == 0x3f) && (bVar4 = 0x3f, bVar9 == 0)) && ((byte)_out == 0)) {
                    uVar19 = ((int)pRVar12 - (int)local_58) + *(int *)(local_a8 + 0x8a4);
                    *(uint *)(local_a8 + 0x8a8) = uVar19;
                    *(RK_U8 **)(local_a8 + 0x8b0) = local_58 + uVar19;
                    uVar18 = *(uint *)((long)local_b8 + 0x20);
                    *(uint *)(local_a8 + 0x8b8) = uVar18;
                    if ((jpegd_debug & 2) != 0) {
                      sVar8 = mpp_packet_get_size(*(MppPacket *)((long)local_b8 + 0x28));
                      _mpp_log_l(4,"jpegd_parser",
                                 "This packet owns %d bytes with length %zu\n\t\thas been decoded %d bytes by software\n\t\tbuf_ptr:%p, buf:%p, sos_len:%d\n\t\thardware start address:%p"
                                 ,(char *)0x0,sVar8,(ulong)*(uint *)(local_a8 + 0x8b8),
                                 (ulong)*(uint *)(local_a8 + 0x8a8),pRVar12,local_58,
                                 (ulong)*(uint *)(local_a8 + 0x8a4),
                                 *(undefined8 *)(local_a8 + 0x8b0));
                      uVar19 = *(uint *)(local_a8 + 0x8a8);
                      uVar18 = *(uint *)((long)ctx + 0x20);
                    }
                    if (uVar18 <= uVar19) {
                      _mpp_log_l(2,"jpegd_parser","stream offset %d is larger than buffer size %d\n"
                                 ,"jpegd_decode_frame");
                      goto LAB_001b9cda;
                    }
                    if (((uVar19 + 2 < uVar18) && (pRVar12[*(uint *)(local_a8 + 0x8a4)] == 0xff)) &&
                       (pRVar12[*(uint *)(local_a8 + 0x8a4) + 1] == 0xd8)) {
                      if ((jpegd_debug & 2) != 0) {
                        _mpp_log_l(4,"jpegd_parser","Encontered SOI again, parse again!\n",
                                   (char *)0x0);
                      }
                      break;
                    }
                    if (*(int *)((long)ctx + 0x4c) == 0) {
                      if ((jpegd_debug & 2) != 0) {
                        _mpp_log_l(4,"jpegd_parser","just scan parts of markers!\n",(char *)0x0);
                      }
                      MVar22 = MPP_OK;
                      task = local_b0;
                      pRVar25 = local_98;
                      goto LAB_001b96b0;
                    }
                    break;
                  }
                }
                else {
                  bVar9 = *(byte *)(lVar13 + 0x89c);
                }
                _mpp_log_l(2,"jpegd_parser",
                           "unsupported sos parameter: scan_start:%d,\n\t\tscan_end:%d, prev_shift:%d, point_transform:%d\n"
                           ,"jpegd_decode_sos",uVar21,(ulong)bVar4,(ulong)bVar9,(ulong)(byte)_out);
                goto LAB_001b9921;
              }
            }
          }
        }
LAB_001b9a1c:
        task = local_b0;
        ctx = local_b8;
        if ((jpegd_debug & 0x40) != 0) {
          _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
        }
      }
LAB_001b9921:
      pcVar10 = "sos decode error\n";
LAB_001b99d2:
      _mpp_log_l(2,"jpegd_parser",pcVar10,"jpegd_decode_frame");
      goto LAB_001b9cda;
    case 0xdb:
      pBVar15 = *(BitReadCtx_t **)((long)local_b8 + 0x60);
      local_80 = *(ulong *)((long)local_b8 + 0x68);
      out = &_out;
      MVar22 = mpp_read_bits(pBVar15,8,out);
      RVar24 = _out;
      pBVar15->ret = MVar22;
      uVar19 = 0xfffffffe;
      if (MVar22 == MPP_OK) {
        MVar22 = mpp_read_bits(pBVar15,8,out);
        uVar19 = 0xfffffffe;
        pBVar15->ret = MVar22;
        if (MVar22 == MPP_OK) {
          uVar19 = ((RVar24 & 0xffU) * 0x100 + (_out & 0xffU)) - 2;
        }
      }
      if (pBVar15->bytes_left_ < uVar19) {
        _mpp_log_l(2,"jpegd_parser","dqt: len %d is too large\n","jpegd_decode_dqt");
LAB_001b9989:
        pcVar10 = "quantize tables decode error\n";
        goto LAB_001b99d2;
      }
      while (0x40 < uVar19) {
        uVar21 = local_78 >> 0x20;
        local_78 = CONCAT44((int)uVar21,uVar19);
        MVar22 = mpp_read_bits(pBVar15,4,&_out);
        pBVar15->ret = MVar22;
        RVar24 = (RK_S32)out;
        if (MVar22 == MPP_OK) {
          RVar24 = _out;
        }
        local_60 = CONCAT44(local_60._4_4_,RVar24);
        if (MVar22 != MPP_OK) {
LAB_001b995e:
          task = local_b0;
          ctx = local_b8;
          if ((jpegd_debug & 0x40) != 0) {
            _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
          }
          goto LAB_001b9989;
        }
        uVar5 = (ushort)_out;
        if (1 < uVar5) {
          pcVar10 = "dqt: invalid precision\n";
LAB_001b9c69:
          _mpp_log_l(2,"jpegd_parser",pcVar10,"jpegd_decode_dqt");
          ctx = local_b8;
          task = local_b0;
          goto LAB_001b9989;
        }
        MVar22 = mpp_read_bits(pBVar15,4,&_out);
        pBVar15->ret = MVar22;
        uVar21 = (ulong)_out;
        RVar24 = (RK_S32)local_88;
        if (MVar22 == MPP_OK) {
          RVar24 = _out;
        }
        local_88 = CONCAT44(local_88._4_4_,RVar24);
        local_90 = uVar21;
        if (MVar22 != MPP_OK) goto LAB_001b995e;
        if (3 < _out) {
          pcVar10 = "dqt: invalid quantize tables ID\n";
          goto LAB_001b9c69;
        }
        if ((jpegd_debug & 2) != 0) {
          _mpp_log_l(4,"jpegd_parser","quantize tables ID=%d\n",(char *)0x0,(ulong)(uint)_out);
        }
        local_68 = uVar21 * 0x80;
        lVar13 = local_68 + local_80;
        lVar28 = 0;
        do {
          MVar22 = mpp_read_bits(pBVar15,(uint)(uVar5 != 0) * 8 + 8,&_out);
          pBVar15->ret = MVar22;
          if (MVar22 != MPP_OK) goto LAB_001b995e;
          *(short *)(lVar13 + lVar28 * 2) = (short)_out;
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0x40);
        bVar4 = *(char *)(local_80 + 0x929) + 1;
        *(byte *)(local_80 + 0x929) = bVar4;
        if (3 < bVar4) {
          _mpp_log_l(2,"jpegd_parser","%d entries qtbl is not supported\n","jpegd_decode_dqt",
                     (ulong)bVar4);
        }
        if ((jpegd_debug & 4) != 0) {
          local_70 = pBVar15;
          _mpp_log_l(4,"jpegd_parser","******Start to print quantize table %d******\n",(char *)0x0,
                     local_88 & 0xffffffff);
          uVar21 = 0;
          do {
            local_a0 = (ulong)*(ushort *)(lVar13 + uVar21 * 2);
            uVar27 = (ulong)*(ushort *)(lVar13 + 0xe + uVar21 * 2);
            _mpp_log_l(4,"jpegd_parser",
                       "%2d~%2d 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x, 0x%02x\n",
                       (char *)0x0,uVar21 & 0xffffffff,(ulong)((int)uVar21 + 7),local_a0,
                       (ulong)*(ushort *)(lVar13 + 2 + uVar21 * 2),
                       (ulong)*(ushort *)(lVar13 + 4 + uVar21 * 2),
                       (ulong)*(ushort *)(lVar13 + 6 + uVar21 * 2),
                       (ulong)*(ushort *)(lVar13 + 8 + uVar21 * 2),
                       (ulong)*(ushort *)(lVar13 + 10 + uVar21 * 2),uVar27,uVar27);
            bVar29 = uVar21 < 0x38;
            uVar21 = uVar21 + 8;
          } while (bVar29);
          _mpp_log_l(4,"jpegd_parser","******Quantize table %d End******\n",(char *)0x0,
                     local_88 & 0xffffffff);
          pBVar15 = local_70;
        }
        task = local_b0;
        uVar5 = *(ushort *)(local_80 + 2 + local_68);
        uVar19 = *(uint *)(local_80 + 0x10 + local_68);
        if ((ushort)uVar19 < uVar5) {
          uVar19 = (uint)uVar5;
        }
        *(int *)(local_80 + 0x880 + local_90 * 4) = (int)(((ulong)uVar19 & 0xffff) >> 1);
        if ((jpegd_debug & 2) != 0) {
          _mpp_log_l(4,"jpegd_parser","qscale[%d]: %d\n",(char *)0x0,local_88 & 0xffffffff);
        }
        out = (RK_S32 *)(local_60 & 0xffffffff);
        uVar19 = (int)local_78 - ((int)local_60 * 0x40 + 0x41U & 0xffff);
      }
      break;
    case 0xdc:
switchD_001b866a_caseD_dc:
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","unhandled coding type(0x%x) in switch..case..\n",(char *)0x0,
                   (ulong)uVar18);
      }
      pBVar15 = *(BitReadCtx_t **)((long)local_b8 + 0x60);
      if (1 < pBVar15->bytes_left_) {
        MVar22 = mpp_read_bits(pBVar15,8,&_out);
        RVar24 = _out;
        pBVar15->ret = MVar22;
        if (MVar22 == MPP_OK) {
          MVar22 = mpp_read_bits(pBVar15,8,&_out);
          pBVar15->ret = MVar22;
          if (MVar22 == MPP_OK) {
            uVar5 = (ushort)(byte)_out | (ushort)(RVar24 << 8);
            if ((1 < uVar5) &&
               (uVar19 = (_out & 0xffU | RVar24 << 8 & 0xffffU) - 2, uVar19 <= pBVar15->bytes_left_)
               ) {
              if (uVar5 != 2) {
                MVar22 = mpp_skip_longbits(pBVar15,uVar19 * 8);
                pBVar15->ret = MVar22;
                if (MVar22 != MPP_OK) goto LAB_001b99ea;
              }
              break;
            }
          }
        }
      }
LAB_001b99ea:
      ctx = local_b8;
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","Fail to skip section 0xFF%02x!\n",(char *)0x0,(ulong)uVar18);
      }
      goto LAB_001b9cda;
    case 0xdd:
      pBVar15 = *(BitReadCtx_t **)((long)local_b8 + 0x60);
      uVar21 = *(ulong *)((long)local_b8 + 0x68);
      MVar22 = mpp_read_bits(pBVar15,8,&_out);
      RVar24 = _out;
      pBVar15->ret = MVar22;
      uVar19 = 0;
      if (MVar22 == MPP_OK) {
        local_a0 = uVar21;
        MVar22 = mpp_read_bits(pBVar15,8,&_out);
        pBVar15->ret = MVar22;
        uVar19 = 0;
        if ((MVar22 != MPP_OK) || (uVar19 = _out & 0xffU | RVar24 << 8, (short)uVar19 != 4))
        goto LAB_001b9abc;
        MVar22 = mpp_read_bits(pBVar15,0x10,&_out);
        pBVar15->ret = MVar22;
        if (MVar22 == MPP_OK) {
          *(RK_S32 *)(local_a0 + 0x924) = _out;
          if ((jpegd_debug & 2) != 0) {
            _mpp_log_l(4,"jpegd_parser","restart interval: %d\n",(char *)0x0);
          }
          break;
        }
        if ((jpegd_debug & 0x40) != 0) {
          _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
        }
      }
      else {
LAB_001b9abc:
        _mpp_log_l(2,"jpegd_parser","DRI length %d error\n","jpegd_decode_dri",
                   (ulong)(uVar19 & 0xffff));
      }
      pcVar10 = "dri decode error\n";
LAB_001b9b64:
      _mpp_log_l(2,"jpegd_parser",pcVar10,"jpegd_decode_frame");
      ctx = local_b8;
      goto LAB_001b9cda;
    default:
      if (uVar18 == 0xc0) {
        pBVar15 = *(BitReadCtx_t **)((long)local_b8 + 0x60);
        lVar13 = *(long *)((long)local_b8 + 0x68);
        MVar22 = mpp_read_bits(pBVar15,8,&_out);
        RVar24 = _out;
        pBVar15->ret = MVar22;
        uVar19 = 0;
        if (MVar22 == MPP_OK) {
          MVar22 = mpp_read_bits(pBVar15,8,&_out);
          pBVar15->ret = MVar22;
          uVar19 = 0;
          if ((MVar22 != MPP_OK) ||
             (uVar19 = (RVar24 & 0xffU) << 8 | _out & 0xffU, uVar19 <= pBVar15->bytes_left_))
          goto LAB_001b9068;
          pcVar10 = "len %d is too large\n";
          uVar21 = (ulong)uVar19;
LAB_001b9ca8:
          _mpp_log_l(2,"jpegd_parser",pcVar10,"jpegd_decode_sof",uVar21);
        }
        else {
LAB_001b9068:
          MVar22 = mpp_read_bits(pBVar15,8,&_out);
          pBVar15->ret = MVar22;
          if (MVar22 == MPP_OK) {
            uVar21 = (ulong)(uint)_out;
            if (_out - 0x11U < 0xfffffff0) {
              pcVar10 = "bits %d is invalid\n";
              goto LAB_001b9ca8;
            }
            *(char *)(lVar13 + 0x928) = (char)_out;
            MVar22 = mpp_read_bits(pBVar15,0x10,&_out);
            RVar24 = _out;
            pBVar15->ret = MVar22;
            if (MVar22 == MPP_OK) {
              MVar22 = mpp_read_bits(pBVar15,0x10,&_out);
              pBVar15->ret = MVar22;
              if (MVar22 == MPP_OK) {
                *(RK_S32 *)(lVar13 + 0x8c4) = RVar24;
                *(RK_S32 *)(lVar13 + 0x8c0) = _out;
                uVar18 = _out + 0xfU & 0xfffffff0;
                *(uint *)(lVar13 + 0x8c8) = uVar18;
                uVar20 = RVar24 + 0xfU & 0xfffffff0;
                *(uint *)(lVar13 + 0x8cc) = uVar20;
                if ((jpegd_debug & 2) != 0) {
                  _mpp_log_l(4,"jpegd_parser","sof0: picture: %dx%d, stride: %dx%d\n",(char *)0x0,
                             (ulong)(uint)_out,(ulong)(uint)RVar24,(ulong)uVar18,(ulong)uVar20);
                }
                MVar22 = mpp_read_bits(pBVar15,8,&_out);
                RVar24 = _out;
                pBVar15->ret = MVar22;
                if (MVar22 == MPP_OK) {
                  uVar27 = (ulong)(uint)_out;
                  if ((_out & 0xfffffffdU) != 1) {
                    pcVar10 = "components number %d error\n";
                    uVar21 = (ulong)(uint)_out;
                    goto LAB_001b9ca8;
                  }
                  if (_out * 3 + 8U != uVar19) {
                    _mpp_log_l(2,"jpegd_parser",
                               "decode_sof0: error, len(%d) mismatch nb_components(%d)\n",
                               "jpegd_decode_sof",(ulong)uVar19,(ulong)(uint)_out);
                  }
                  *(RK_S32 *)(lVar13 + 0x8d0) = RVar24;
                  *(undefined8 *)(lVar13 + 0x910) = 0x100000001;
                  uVar14 = 0;
                  do {
                    MVar22 = mpp_read_bits(pBVar15,8,&_out);
                    pBVar15->ret = MVar22;
                    if (MVar22 != MPP_OK) goto LAB_001b9934;
                    *(RK_S32 *)(lVar13 + 0x8d4 + uVar14 * 4) = _out + -1;
                    MVar22 = mpp_read_bits(pBVar15,4,&_out);
                    pBVar15->ret = MVar22;
                    if (MVar22 != MPP_OK) goto LAB_001b9934;
                    *(RK_S32 *)(lVar13 + 0x8e0 + uVar14 * 4) = _out;
                    MVar22 = mpp_read_bits(pBVar15,4,&_out);
                    pBVar15->ret = MVar22;
                    if (MVar22 != MPP_OK) goto LAB_001b9934;
                    *(RK_S32 *)(lVar13 + 0x8ec + uVar14 * 4) = _out;
                    uVar19 = *(uint *)(lVar13 + 0x8e0 + uVar14 * 4);
                    if ((uVar19 == 0) || (_out == 0)) {
                      _mpp_log_l(2,"jpegd_parser","Invalid sampling factor in component %d %d:%d\n",
                                 "jpegd_decode_sof",uVar14 & 0xffffffff,(ulong)uVar19,
                                 (ulong)(uint)_out);
                      goto LAB_001b9caf;
                    }
                    uVar18 = _out;
                    if (*(uint *)(lVar13 + 0x910) < uVar19) {
                      *(uint *)(lVar13 + 0x910) = uVar19;
                      uVar18 = *(uint *)(lVar13 + 0x8ec + uVar14 * 4);
                    }
                    if (*(uint *)(lVar13 + 0x914) < uVar18) {
                      *(uint *)(lVar13 + 0x914) = uVar18;
                    }
                    MVar22 = mpp_read_bits(pBVar15,8,&_out);
                    pBVar15->ret = MVar22;
                    if (MVar22 != MPP_OK) goto LAB_001b9934;
                    uVar21 = (ulong)(uint)_out;
                    *(RK_S32 *)(lVar13 + 0x918 + uVar14 * 4) = _out;
                    if (3 < (uint)_out) {
                      pcVar10 = "quant_index %d is invalid\n";
                      goto LAB_001b9ca8;
                    }
                    if ((jpegd_debug & 2) != 0) {
                      _mpp_log_l(4,"jpegd_parser","component %d %d:%d id: %d quant_id:%d\n",
                                 (char *)0x0,uVar14 & 0xffffffff,
                                 (ulong)*(uint *)(lVar13 + 0x8e0 + uVar14 * 4),
                                 (ulong)*(uint *)(lVar13 + 0x8ec + uVar14 * 4),
                                 (ulong)*(uint *)(lVar13 + 0x8d4 + uVar14 * 4),uVar21);
                    }
                    uVar14 = uVar14 + 1;
                  } while (uVar27 != uVar14);
                  MVar22 = jpeg_judge_yuv_mode(*(JpegdCtx **)((long)local_b8 + 0x68));
                  if (MVar22 == MPP_OK) {
                    if (*(char *)(*(long *)((long)local_b8 + 0x68) + 0x928) == '\b') {
                      *(undefined1 *)(local_a8 + 0x8a0) = 1;
                      task = local_b0;
                      break;
                    }
                    _mpp_log_l(2,"jpegd_parser",
                               "Illegal sample precision %d.\n                    For baseline, it should be 8\n"
                               ,"jpegd_decode_frame");
                    ctx = local_b8;
                    task = local_b0;
                    goto LAB_001b9cda;
                  }
                }
              }
            }
          }
LAB_001b9934:
          if ((jpegd_debug & 0x40) != 0) {
            _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
          }
        }
LAB_001b9caf:
        _mpp_log_l(2,"jpegd_parser","sof0 decode error\n","jpegd_decode_frame");
        ctx = local_b8;
        task = local_b0;
        goto LAB_001b9cda;
      }
      if (uVar18 != 0xc4) goto switchD_001b866a_caseD_dc;
      pBVar15 = *(BitReadCtx_t **)((long)local_b8 + 0x60);
      local_88 = *(ulong *)((long)local_b8 + 0x68);
      MVar22 = mpp_read_bits(pBVar15,8,&_out);
      RVar24 = _out;
      pBVar15->ret = MVar22;
      uVar21 = 0xfffffffe;
      if (MVar22 == MPP_OK) {
        MVar22 = mpp_read_bits(pBVar15,8,&_out);
        pBVar15->ret = MVar22;
        if (MVar22 == MPP_OK) {
          uVar21 = (ulong)(((RVar24 & 0xffU) * 0x100 + (_out & 0xffU)) - 2);
        }
      }
      if (pBVar15->bytes_left_ < (uint)uVar21) {
        pcVar10 = "dht: len %d is too large\n";
LAB_001b9f8f:
        _mpp_log_l(2,"jpegd_parser",pcVar10,"jpegd_decode_dht",uVar21 & 0xffffffff);
        ctx = local_b8;
LAB_001b99c4:
        pcVar10 = "huffman table decode error\n";
        goto LAB_001b99d2;
      }
      if ((jpegd_debug & 2) != 0) {
        _mpp_log_l(4,"jpegd_parser","dht: huffman tables length=%d\n",(char *)0x0,uVar21);
      }
      if ((uint)uVar21 != 0) {
        local_60 = local_88 + 0x200;
        local_68 = local_88 + 0x798;
        local_70 = (BitReadCtx_t *)(local_88 + 0x240);
        local_a0 = local_88 + 0x7d8;
        local_48 = local_a0;
        do {
          if ((uint)uVar21 < 0x11) {
            pcVar10 = "dht: len %d is too small\n";
            goto LAB_001b9f8f;
          }
          local_78 = uVar21;
          MVar22 = mpp_read_bits(pBVar15,4,&_out);
          RVar24 = _out;
          pBVar15->ret = MVar22;
          RVar6 = (RK_S32)local_90;
          if (MVar22 == MPP_OK) {
            RVar6 = _out;
          }
          local_90 = CONCAT44(local_90._4_4_,RVar6);
          if (MVar22 != MPP_OK) {
LAB_001b9999:
            task = local_b0;
            ctx = local_b8;
            if ((jpegd_debug & 0x40) != 0) {
              _mpp_log_l(4,"jpegd_parser","bit read error!\n",(char *)0x0);
            }
            goto LAB_001b99c4;
          }
          if (1 < (uint)_out) {
            pcVar10 = "table type %d error\n";
            uVar21 = (ulong)(uint)_out;
LAB_001b9fe8:
            _mpp_log_l(2,"jpegd_parser",pcVar10,"jpegd_decode_dht",uVar21);
            ctx = local_b8;
            task = local_b0;
            goto LAB_001b99c4;
          }
          MVar22 = mpp_read_bits(pBVar15,4,&_out);
          pBVar15->ret = MVar22;
          uVar21 = (ulong)(uint)_out;
          local_a0 = local_a0 & 0xffffffff;
          if (MVar22 != MPP_OK) goto LAB_001b9999;
          local_a0 = uVar21;
          if (1 < (uint)_out) {
            pcVar10 = "table id %d is unsupported for baseline\n";
            goto LAB_001b9fe8;
          }
          if (RVar24 == 0) {
            lVar28 = uVar21 * 0x74 + local_68;
            lVar13 = 0;
            uVar21 = 0;
            do {
              MVar22 = mpp_read_bits(pBVar15,8,&_out);
              pBVar15->ret = MVar22;
              if (MVar22 != MPP_OK) goto LAB_001b9999;
              *(RK_S32 *)(lVar28 + lVar13 * 4) = _out;
              uVar19 = (int)uVar21 + _out;
              uVar21 = (ulong)uVar19;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0x10);
            *(uint *)(lVar28 + 0x70) = uVar19;
          }
          else {
            lVar28 = uVar21 * 0x2cc + local_60;
            lVar13 = 0;
            uVar21 = 0;
            do {
              MVar22 = mpp_read_bits(pBVar15,8,&_out);
              pBVar15->ret = MVar22;
              if (MVar22 != MPP_OK) goto LAB_001b9999;
              *(RK_S32 *)(lVar28 + lVar13 * 4) = _out;
              uVar19 = (int)uVar21 + _out;
              uVar21 = (ulong)uVar19;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 0x10);
            *(uint *)(lVar28 + 0x2c8) = uVar19;
          }
          pBVar3 = local_70;
          task = local_b0;
          ctx = local_b8;
          uVar19 = (int)local_78 - 0x11;
          uVar18 = (uint)uVar21;
          local_78 = (ulong)(uVar19 - uVar18);
          if ((uVar19 < uVar18) || (RVar24 == 0 && 0xc < uVar18)) {
            uVar27 = local_90 & 0xffffffff;
LAB_001ba04e:
            _mpp_log_l(2,"jpegd_parser","table type %d, code word number %d error\n",
                       "jpegd_decode_dht",uVar27,uVar21);
            goto LAB_001b99c4;
          }
          if ((0xa2 < uVar18) && ((RK_S32)local_90 == 1)) {
            uVar27 = 1;
            goto LAB_001ba04e;
          }
          bVar4 = (char)local_a0 * '\x02';
          uVar27 = local_a0 & 0xffffffff;
          if (RVar24 == 0) {
            *(byte *)(local_88 + 0x92a) = *(byte *)(local_88 + 0x92a) | (byte)(1 << (bVar4 & 0x1f));
            if (uVar18 == 0) goto LAB_001b89c4;
            lVar13 = uVar27 * 0x74 + local_48;
            uVar27 = 0;
            uVar14 = 0;
            local_80 = uVar21;
            do {
              MVar22 = mpp_read_bits(pBVar15,8,&_out);
              pBVar15->ret = MVar22;
              if (MVar22 != MPP_OK) goto LAB_001b9999;
              if ((uint)uVar14 < (uint)_out) {
                uVar14 = (ulong)(uint)_out;
              }
              *(RK_S32 *)(lVar13 + uVar27 * 4) = _out;
              uVar27 = uVar27 + 1;
            } while (local_80 != uVar27);
          }
          else {
            *(byte *)(local_88 + 0x92a) = *(byte *)(local_88 + 0x92a) | (byte)(2 << (bVar4 & 0x1f));
            if (uVar18 == 0) {
LAB_001b89c4:
              uVar14 = 0;
            }
            else {
              uVar26 = 0;
              uVar14 = 0;
              local_80 = uVar21;
              do {
                MVar22 = mpp_read_bits(pBVar15,8,&_out);
                pBVar15->ret = MVar22;
                if (MVar22 != MPP_OK) goto LAB_001b9999;
                if ((uint)uVar14 < (uint)_out) {
                  uVar14 = (ulong)(uint)_out;
                }
                *(RK_S32 *)((long)pBVar3 + uVar26 * 4 + uVar27 * 0x2cc) = _out;
                uVar26 = uVar26 + 1;
              } while (local_80 != uVar26);
            }
          }
          if ((jpegd_debug & 2) != 0) {
            _mpp_log_l(4,"jpegd_parser","dht: type=%d id=%d code_word_num=%d, code_max=%d, len=%d\n"
                       ,(char *)0x0,local_90 & 0xffffffff,local_a0,uVar21,uVar14,local_78);
          }
          uVar21 = local_78;
          task = local_b0;
        } while ((int)local_78 != 0);
      }
      *(undefined1 *)(local_a8 + 0x89e) = 1;
    }
    pRVar12 = (RK_U8 *)**(undefined8 **)((long)local_b8 + 0x60);
    if (local_98 <= pRVar12) goto LAB_001b9a50;
    goto LAB_001b8502;
  }
LAB_001b9cda:
  MVar22 = MPP_ERR_STREAM;
  if ((jpegd_debug & 1) != 0) goto LAB_001b9ce5;
  goto LAB_001b9d0b;
code_r0x001b8538:
  if ((jpegd_debug & 2) != 0) {
    _mpp_log_l(4,"jpegd_parser","0x%x is not a marker\n",(char *)0x0,(ulong)bVar4);
  }
  pRVar25 = pRVar25 + 1;
  pRVar12 = pRVar12 + 1;
  if (local_98 <= pRVar25) {
LAB_001b967a:
    pRVar12 = pRVar25;
    pRVar25 = local_98;
    MVar22 = MPP_ERR_STREAM;
    task = local_b0;
    if ((jpegd_debug & 2) != 0) {
      _mpp_log_l(4,"jpegd_parser","start code not found\n",(char *)0x0);
      task = local_b0;
    }
    goto LAB_001b96b0;
  }
  goto LAB_001b850b;
LAB_001b9a50:
  MVar22 = MPP_OK;
  pRVar25 = local_98;
LAB_001b96b0:
  ctx = local_b8;
  if (*(char *)(local_a8 + 0x89e) == '\0') {
    if ((jpegd_debug & 2) != 0) {
      _mpp_log_l(4,"jpegd_parser","sorry, DHT is not found!\n",(char *)0x0);
    }
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_setup_default_dht");
    }
    pRVar25 = local_98;
    lVar13 = *(long *)((long)ctx + 0x68);
    lVar28 = 0;
    bVar29 = true;
    do {
      bVar16 = bVar29;
      lVar17 = lVar28 * 0x2cc + lVar13 + 0x200;
      puVar1 = (&PTR_jpegd_setup_default_dht_bits_ac_luminance_002ed3a0)[lVar28];
      puVar2 = (&PTR_jpegd_setup_default_dht_val_ac_luminance_002ed3c0)[lVar28];
      lVar28 = 0;
      uVar19 = 0;
      do {
        bVar4 = puVar1[lVar28];
        *(uint *)(lVar17 + lVar28 * 4) = (uint)bVar4;
        uVar19 = uVar19 + bVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 0x10);
      *(uint *)(lVar17 + 0x2c8) = uVar19;
      if (uVar19 != 0) {
        uVar21 = 0;
        do {
          *(uint *)(lVar17 + 0x40 + uVar21 * 4) = (uint)(byte)puVar2[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar19 != uVar21);
      }
      lVar28 = 1;
      bVar29 = false;
    } while (bVar16);
    lVar28 = 0;
    bVar29 = true;
    do {
      bVar16 = bVar29;
      lVar17 = lVar28 * 0x74 + lVar13 + 0x798;
      puVar1 = (&PTR_jpegd_setup_default_dht_bits_dc_luminance_002ed3b0)[lVar28];
      puVar2 = (&PTR_jpegd_setup_default_dht_val_dc_002ed3d0)[lVar28];
      lVar28 = 0;
      uVar19 = 0;
      do {
        bVar4 = puVar1[lVar28];
        *(uint *)(lVar17 + lVar28 * 4) = (uint)bVar4;
        uVar19 = uVar19 + bVar4;
        lVar28 = lVar28 + 1;
      } while (lVar28 != 0x10);
      *(uint *)(lVar17 + 0x70) = uVar19;
      if (uVar19 != 0) {
        uVar21 = 0;
        do {
          *(uint *)(lVar17 + 0x40 + uVar21 * 4) = (uint)(byte)puVar2[uVar21];
          uVar21 = uVar21 + 1;
        } while (uVar19 != uVar21);
      }
      lVar28 = 1;
      bVar29 = false;
    } while (bVar16);
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_setup_default_dht");
    }
    *(undefined1 *)(local_a8 + 0x92a) = 0xf;
    task = local_b0;
  }
  if (*(char *)(local_a8 + 0x8a0) == '\0') {
    _mpp_log_l(2,"jpegd_parser","sof marker not found!\n","jpegd_decode_frame");
    MVar22 = MPP_ERR_STREAM;
  }
  if (*(char *)(local_a8 + 0x89f) == '\0') {
    if (pRVar12 < pRVar25) {
      pRVar12 = (RK_U8 *)memchr(pRVar12,0xffd9,(ulong)(uint)((int)local_50 - (int)pRVar12));
      if (pRVar12 != (RK_U8 *)0x0 && pRVar12 < pRVar25) goto LAB_001b98e8;
    }
    else {
      _mpp_log_l(2,"jpegd_parser","buf ptr %p is overflow the buf end %p.",(char *)0x0,pRVar12,
                 pRVar25);
    }
    _mpp_log_l(2,"jpegd_parser","EOI marker not found!\n","jpegd_decode_frame");
    MVar22 = MPP_ERR_STREAM;
  }
LAB_001b98e8:
  if ((jpegd_debug & 1) != 0) {
LAB_001b9ce5:
    _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_decode_frame");
  }
  if (MVar22 == MPP_OK) {
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_allocate_frame");
    }
    lVar13 = *(long *)((long)ctx + 0x68);
    slots = *(MppBufSlots *)((long)ctx + 8);
    s = *(MppFrame *)((long)ctx + 0x30);
    _out = *(int *)((long)ctx + 0x10);
    if (_out == -1) {
      v = MPP_FMT_YUV420SP;
      if ((ulong)*(uint *)(lVar13 + 0x894) < 5) {
        v = *(MppFrameFormat *)(&DAT_0028b934 + (ulong)*(uint *)(lVar13 + 0x894) * 4);
      }
      mpp_frame_set_fmt(s,v);
      mpp_frame_set_width(s,*(RK_U32 *)(lVar13 + 0x8c0));
      mpp_frame_set_height(s,*(RK_U32 *)(lVar13 + 0x8c4));
      mpp_frame_set_hor_stride(s,*(RK_U32 *)(lVar13 + 0x8c8));
      mpp_frame_set_ver_stride(s,*(RK_U32 *)(lVar13 + 0x8cc));
      mpp_frame_set_pts(s,*(RK_S64 *)((long)ctx + 0x38));
      if (*(int *)((long)ctx + 0x40) != 0) {
        mpp_frame_set_eos(s,1);
      }
      mpp_buf_slot_get_unused(slots,&_out);
      *(RK_S32 *)((long)ctx + 0x10) = _out;
      if ((jpegd_debug & 0x20) != 0) {
        _mpp_log_l(4,"jpegd_parser","frame_slot_index:%d\n",(char *)0x0);
      }
      local_34 = 2;
      mpp_slots_set_prop(slots,SLOTS_NUMERATOR,&local_34);
      local_34 = 1;
      mpp_slots_set_prop(slots,SLOTS_DENOMINATOR,&local_34);
      MVar22 = mpp_buf_slot_set_prop(slots,_out,SLOT_FRAME,s);
      if (MVar22 != MPP_OK) {
        return MPP_ERR_VALUE;
      }
      mpp_buf_slot_set_flag(slots,_out,SLOT_CODEC_USE);
      mpp_buf_slot_set_flag(slots,_out,SLOT_HAL_OUTPUT);
    }
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_allocate_frame");
    }
    (task->syntax).data = *(void **)((long)ctx + 0x68);
    (task->syntax).number = 0x930;
    RVar24 = *(RK_S32 *)((long)ctx + 0x10);
    task->output = RVar24;
    task->valid = 1;
    if ((jpegd_debug & 1) != 0) {
      _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_update_frame");
      RVar24 = *(RK_S32 *)((long)ctx + 0x10);
    }
    mpp_buf_slot_clr_flag(*(MppBufSlots *)((long)ctx + 8),RVar24,SLOT_CODEC_USE);
    *(undefined4 *)((long)ctx + 0x10) = 0xffffffff;
    MVar22 = MPP_OK;
    if ((jpegd_debug & 1) != 0) {
      MVar22 = MPP_OK;
      _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_update_frame");
    }
    goto LAB_001b9d10;
  }
LAB_001b9d0b:
  *(byte *)&task->flags = *(byte *)&task->flags | 4;
LAB_001b9d10:
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_parse");
  }
  return MVar22;
}

Assistant:

static MPP_RET jpegd_parse(void *ctx, HalDecTask *task)
{
    jpegd_dbg_func("enter\n");
    MPP_RET ret = MPP_OK;
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;
    task->valid = 0;

    JpegCtx->buffer = (RK_U8 *)mpp_packet_get_data(JpegCtx->input_packet);

    memset(JpegCtx->syntax, 0, sizeof(JpegdSyntax));

    ret = jpegd_decode_frame(JpegCtx);
    if (MPP_OK == ret) {
        if (jpegd_allocate_frame(JpegCtx))
            return MPP_ERR_VALUE;

        task->syntax.data = (void *)JpegCtx->syntax;
        task->syntax.number = sizeof(JpegdSyntax);
        task->output = JpegCtx->frame_slot_index;
        task->valid = 1;

        jpegd_update_frame(JpegCtx);
    } else
        task->flags.parse_err = 1;

    jpegd_dbg_func("exit\n");
    return ret;
}